

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

uint stb_vorbis_stream_length_in_samples(stb_vorbis *f)

{
  uint32 uVar1;
  long in_RDI;
  uint32 *in_stack_00000008;
  char header [6];
  uint32 hi;
  uint32 lo;
  uint last;
  uint last_page_loc;
  uint end;
  uint previous_safe;
  uint restore_offset;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint32 local_20;
  int local_1c;
  uint local_18;
  undefined4 local_14;
  
  if (*(int *)(in_RDI + 0x374) == 0) {
    stb_vorbis_get_file_offset
              ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    uVar1 = vorbis_find_page(_lo,stack0x00000010,in_stack_00000008);
    if (uVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x9c) = 0x24;
      *(undefined4 *)(in_RDI + 0x374) = 0xffffffff;
    }
    else {
      local_18 = stb_vorbis_get_file_offset
                           ((stb_vorbis *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      while (local_1c == 0) {
        set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        0);
        uVar1 = vorbis_find_page(_lo,stack0x00000010,in_stack_00000008);
        if (uVar1 == 0) break;
        local_18 = stb_vorbis_get_file_offset
                             ((stb_vorbis *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0)
      ;
      getn((vorb *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
           (uint8 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffcc);
      local_20 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      uVar1 = get32((vorb *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if ((local_20 == 0xffffffff) && (uVar1 == 0xffffffff)) {
        *(undefined4 *)(in_RDI + 0x9c) = 0x24;
        *(undefined4 *)(in_RDI + 0x374) = 0xffffffff;
      }
      else {
        if (uVar1 != 0) {
          local_20 = 0xfffffffe;
        }
        *(uint32 *)(in_RDI + 0x374) = local_20;
        *(uint *)(in_RDI + 0x70) = local_18;
        *(undefined4 *)(in_RDI + 0x74) = local_14;
        *(uint32 *)(in_RDI + 0x78) = local_20;
      }
    }
    set_file_offset((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  if (*(int *)(in_RDI + 0x374) == -1) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(uint *)(in_RDI + 0x374);
  }
  return uVar2;
}

Assistant:

unsigned int stb_vorbis_stream_length_in_samples(stb_vorbis *f)
{
   unsigned int restore_offset, previous_safe;
   unsigned int end, last_page_loc;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);
   if (!f->total_samples) {
      unsigned int last;
      uint32 lo,hi;
      char header[6];

      // first, store the current decode position so we can restore it
      restore_offset = stb_vorbis_get_file_offset(f);

      // now we want to seek back 64K from the end (the last page must
      // be at most a little less than 64K, but let's allow a little slop)
      if (f->stream_len >= 65536 && f->stream_len-65536 >= f->first_audio_page_offset)
         previous_safe = f->stream_len - 65536;
      else
         previous_safe = f->first_audio_page_offset;

      set_file_offset(f, previous_safe);
      // previous_safe is now our candidate 'earliest known place that seeking
      // to will lead to the final page'

      if (!vorbis_find_page(f, &end, &last)) {
         // if we can't find a page, we're hosed!
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = 0xffffffff;
         goto done;
      }

      // check if there are more pages
      last_page_loc = stb_vorbis_get_file_offset(f);

      // stop when the last_page flag is set, not when we reach eof;
      // this allows us to stop short of a 'file_section' end without
      // explicitly checking the length of the section
      while (!last) {
         set_file_offset(f, end);
         if (!vorbis_find_page(f, &end, &last)) {
            // the last page we found didn't have the 'last page' flag
            // set. whoops!
            break;
         }
         previous_safe = last_page_loc+1;
         last_page_loc = stb_vorbis_get_file_offset(f);
      }

      set_file_offset(f, last_page_loc);

      // parse the header
      getn(f, (unsigned char *)header, 6);
      // extract the absolute granule position
      lo = get32(f);
      hi = get32(f);
      if (lo == 0xffffffff && hi == 0xffffffff) {
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = SAMPLE_unknown;
         goto done;
      }
      if (hi)
         lo = 0xfffffffe; // saturate
      f->total_samples = lo;

      f->p_last.page_start = last_page_loc;
      f->p_last.page_end   = end;
      f->p_last.last_decoded_sample = lo;

     done:
      set_file_offset(f, restore_offset);
   }
   return f->total_samples == SAMPLE_unknown ? 0 : f->total_samples;
}